

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_fmt_conv.c
# Opt level: O3

IHEVCD_ERROR_T
ihevcd_fmt_conv(codec_t *ps_codec,process_ctxt_t *ps_proc,UWORD8 *pu1_y_dst,UWORD8 *pu1_u_dst,
               UWORD8 *pu1_v_dst,WORD32 cur_row,WORD32 num_rows)

{
  long lVar1;
  short sVar2;
  ushort uVar3;
  int iVar4;
  IV_COLOR_FORMAT_T IVar5;
  IV_COLOR_FORMAT_T IVar6;
  sps_t *psVar7;
  WORD32 WVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  UWORD8 *pUVar17;
  UWORD8 *__dest;
  UWORD8 *pUVar18;
  bool bVar19;
  UWORD8 *local_68;
  UWORD8 *local_60;
  
  if (num_rows != 0) {
    psVar7 = ps_proc->ps_sps;
    bVar19 = psVar7->i1_chroma_format_idc == '\x01';
    pUVar18 = ps_codec->ps_disp_buf->pu1_luma;
    iVar4 = ps_codec->i4_strd;
    iVar13 = psVar7->i2_pic_crop_top_offset * iVar4;
    sVar2 = psVar7->i2_pic_crop_left_offset;
    iVar10 = ps_codec->i4_share_disp_buf;
    IVar5 = ps_codec->e_ref_chroma_fmt;
    local_68 = pu1_v_dst;
    local_60 = pu1_u_dst;
    if (((iVar10 == 1) && (ps_codec->e_chroma_fmt == IV_YUV_420P)) &&
       (0 < (long)ps_codec->i4_share_disp_buf_cnt)) {
      lVar16 = 0;
      do {
        if (iVar4 * 0x50 + 0x50 ==
            (int)pUVar18 - *(int *)((long)ps_codec->s_disp_buffer[0].pu1_bufs + lVar16)) {
          lVar1 = (long)iVar4 * 0x14 + 0x28;
          local_60 = (UWORD8 *)
                     (*(long *)((long)ps_codec->s_disp_buffer[0].pu1_bufs + lVar16 + 8) + lVar1);
          local_68 = (UWORD8 *)
                     (lVar1 + *(long *)((long)ps_codec->s_disp_buffer[0].pu1_bufs + lVar16 + 0x10));
          break;
        }
        lVar16 = lVar16 + 0x308;
      } while ((long)ps_codec->i4_share_disp_buf_cnt * 0x308 - lVar16 != 0);
    }
    iVar15 = ps_codec->i4_disp_strd;
    lVar16 = (long)(iVar15 * cur_row);
    pUVar17 = ps_codec->ps_disp_buf->pu1_chroma;
    if (((ps_codec->i4_flush_mode == 0) && (ps_codec->i4_disp_buf_id == ps_proc->i4_cur_pic_buf_id))
       && (1 < ps_codec->i4_num_cores)) {
      uVar3 = psVar7->i2_pic_wd_in_ctb;
      while (0 < (short)uVar3) {
        iVar11 = 1 << (psVar7->i1_log2_ctb_size & 0x1fU);
        if (iVar11 <= num_rows) {
          iVar11 = num_rows;
        }
        bVar9 = 1;
        iVar14 = (((int)psVar7->i2_pic_crop_top_offset << bVar19) + cur_row + iVar11 >>
                 (psVar7->i1_log2_ctb_size & 0x1fU)) + 1;
        iVar11 = psVar7->i2_pic_ht_in_ctb + -1;
        if (iVar14 < iVar11) {
          iVar11 = iVar14;
        }
        uVar12 = 0;
        do {
          bVar9 = bVar9 & ps_codec->pu1_proc_map[uVar12 + (long)(int)(iVar11 * (uint)uVar3)];
          uVar12 = uVar12 + 1;
        } while (uVar3 != uVar12);
        if (bVar9 != 0) break;
        ithread_yield();
        uVar3 = psVar7->i2_pic_wd_in_ctb;
      }
    }
    iVar15 = iVar15 * (cur_row / 2);
    pUVar18 = pUVar18 + (long)(iVar13 + sVar2 << bVar19) + (long)(iVar4 * cur_row);
    pUVar17 = pUVar17 + (long)(iVar4 * (cur_row / 2)) + (long)(iVar13 + sVar2 * 2);
    __dest = pu1_y_dst + lVar16;
    IVar6 = ps_codec->e_chroma_fmt;
    WVar8 = SUB14(IVar5 == IV_YUV_420SP_UV,0);
    if ((int)IVar6 < 0xb) {
      if (IVar6 == IV_YUV_420P) {
        iVar15 = iVar15 / 2;
        if (0 < num_rows && iVar10 != 1) {
          iVar4 = ps_codec->i4_disp_wd;
          iVar10 = num_rows;
          do {
            memcpy(__dest,pUVar18,(long)iVar4);
            __dest = __dest + ps_codec->i4_disp_strd;
            pUVar18 = pUVar18 + ps_codec->i4_strd;
            iVar10 = iVar10 + -1;
          } while (iVar10 != 0);
        }
        (*(ps_codec->s_func_selector).ihevcd_fmt_conv_420sp_to_420p_fptr)
                  (pUVar18,pUVar17,__dest,local_60 + iVar15,local_68 + iVar15,ps_codec->i4_disp_wd,
                   num_rows,ps_codec->i4_strd,ps_codec->i4_strd,ps_codec->i4_disp_strd,
                   ps_codec->i4_disp_strd / 2,WVar8,1);
      }
      else if (IVar6 == IV_RGB_565) {
        (*(ps_codec->s_func_selector).ihevcd_fmt_conv_420sp_to_rgb565_fptr)
                  (pUVar18,pUVar17,(UWORD16 *)(pu1_y_dst + lVar16 * 2),ps_codec->i4_disp_wd,num_rows
                   ,ps_codec->i4_strd,ps_codec->i4_strd,ps_codec->i4_disp_strd,WVar8);
      }
    }
    else if (IVar6 - IV_YUV_420SP_UV < 2) {
      (*(ps_codec->s_func_selector).ihevcd_fmt_conv_420sp_to_420sp_fptr)
                (pUVar18,pUVar17,__dest,local_60 + iVar15,ps_codec->i4_disp_wd,num_rows,
                 ps_codec->i4_strd,ps_codec->i4_strd,ps_codec->i4_disp_strd,ps_codec->i4_disp_strd);
    }
    else if (IVar6 == IV_RGBA_8888) {
      if (IVar5 != IV_YUV_420SP_UV) {
        __assert_fail("(is_u_first == 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/decoder/ihevcd_fmt_conv.c"
                      ,0x379,
                      "IHEVCD_ERROR_T ihevcd_fmt_conv(codec_t *, process_ctxt_t *, UWORD8 *, UWORD8 *, UWORD8 *, WORD32, WORD32)"
                     );
      }
      (*(ps_codec->s_func_selector).ihevcd_fmt_conv_420sp_to_rgba8888_fptr)
                (pUVar18,pUVar17,(UWORD32 *)(pu1_y_dst + lVar16 * 4),ps_codec->i4_disp_wd,num_rows,
                 ps_codec->i4_strd,ps_codec->i4_strd,ps_codec->i4_disp_strd,WVar8);
    }
  }
  return 0;
}

Assistant:

IHEVCD_ERROR_T ihevcd_fmt_conv(codec_t *ps_codec,
                               process_ctxt_t *ps_proc,
                               UWORD8 *pu1_y_dst,
                               UWORD8 *pu1_u_dst,
                               UWORD8 *pu1_v_dst,
                               WORD32 cur_row,
                               WORD32 num_rows)
{
    IHEVCD_ERROR_T ret = (IHEVCD_ERROR_T)IHEVCD_SUCCESS;
    pic_buf_t *ps_disp_pic;
    UWORD8 *pu1_y_src, *pu1_uv_src;
    UWORD8 *pu1_y_dst_tmp, *pu1_uv_dst_tmp;
    UWORD8 *pu1_u_dst_tmp, *pu1_v_dst_tmp;
    UWORD16 *pu2_rgb_dst_tmp;
    UWORD32 *pu4_rgb_dst_tmp;
    WORD32 is_u_first;
    UWORD8 *pu1_luma;
    UWORD8 *pu1_chroma;
    sps_t *ps_sps;
    WORD32 disable_luma_copy;
    WORD32 crop_unit_x, crop_unit_y;

    if(0 == num_rows)
        return ret;

    /* In case processing is disabled, then no need to format convert/copy */
    PROFILE_DISABLE_FMT_CONV();
    ps_sps = ps_proc->ps_sps;

    crop_unit_x = 1;
    crop_unit_y = 1;

    if(CHROMA_FMT_IDC_YUV420 == ps_sps->i1_chroma_format_idc)
    {
        crop_unit_x = 2;
        crop_unit_y = 2;
    }

    ps_disp_pic = ps_codec->ps_disp_buf;
    pu1_luma = ps_disp_pic->pu1_luma;
    pu1_chroma = ps_disp_pic->pu1_chroma;


    /* Take care of cropping */
    pu1_luma    += ps_codec->i4_strd * ps_sps->i2_pic_crop_top_offset * crop_unit_y + ps_sps->i2_pic_crop_left_offset * crop_unit_x;

    /* Left offset is multiplied by 2 because buffer is UV interleaved */
    pu1_chroma  += ps_codec->i4_strd * ps_sps->i2_pic_crop_top_offset + ps_sps->i2_pic_crop_left_offset * 2;


    is_u_first = (IV_YUV_420SP_UV == ps_codec->e_ref_chroma_fmt) ? 1 : 0;

    /* In case of 420P output luma copy is disabled for shared mode */
    disable_luma_copy = 0;
    if(1 == ps_codec->i4_share_disp_buf)
    {
        disable_luma_copy = 1;
    }



    {
        pu1_y_src   = pu1_luma + cur_row * ps_codec->i4_strd;
        pu1_uv_src  = pu1_chroma + (cur_row / 2) * ps_codec->i4_strd;

        /* In case of shared mode, with 420P output, get chroma destination */
        if((1 == ps_codec->i4_share_disp_buf) && (IV_YUV_420P == ps_codec->e_chroma_fmt))
        {
            WORD32 i;
            for(i = 0; i < ps_codec->i4_share_disp_buf_cnt; i++)
            {
                WORD32 diff = ps_disp_pic->pu1_luma - ps_codec->s_disp_buffer[i].pu1_bufs[0];
                if(diff == (ps_codec->i4_strd * PAD_TOP + PAD_LEFT))
                {
                    pu1_u_dst = ps_codec->s_disp_buffer[i].pu1_bufs[1];
                    pu1_u_dst += (ps_codec->i4_strd * PAD_TOP) / 4 + (PAD_LEFT / 2);

                    pu1_v_dst = ps_codec->s_disp_buffer[i].pu1_bufs[2];
                    pu1_v_dst += (ps_codec->i4_strd * PAD_TOP) / 4 + (PAD_LEFT / 2);
                    break;
                }
            }
        }
        pu2_rgb_dst_tmp  = (UWORD16 *)pu1_y_dst;
        pu2_rgb_dst_tmp  += cur_row * ps_codec->i4_disp_strd;
        pu4_rgb_dst_tmp  = (UWORD32 *)pu1_y_dst;
        pu4_rgb_dst_tmp  += cur_row * ps_codec->i4_disp_strd;
        pu1_y_dst_tmp  = pu1_y_dst  + cur_row * ps_codec->i4_disp_strd;
        pu1_uv_dst_tmp = pu1_u_dst  + (cur_row / 2) * ps_codec->i4_disp_strd;
        pu1_u_dst_tmp = pu1_u_dst  + (cur_row / 2) * ps_codec->i4_disp_strd / 2;
        pu1_v_dst_tmp = pu1_v_dst  + (cur_row / 2) * ps_codec->i4_disp_strd / 2;

        /* In case of multi threaded implementation, format conversion might be called
         * before reconstruction is completed. If the frame being converted/copied
         * is same as the frame being reconstructed,
         * Check how many rows can be format converted
         * Convert those many rows and then check for remaining rows and so on
         */

        if((0 == ps_codec->i4_flush_mode) && (ps_codec->i4_disp_buf_id == ps_proc->i4_cur_pic_buf_id) && (1 < ps_codec->i4_num_cores))
        {
            WORD32 idx;
            UWORD8 *pu1_buf;
            WORD32 status;
            WORD32 last_row = cur_row + num_rows;
            WORD32 last_ctb_y;
            UWORD32 ctb_in_row;

            while(1)
            {
                last_row = cur_row + MAX(num_rows, (1 << ps_sps->i1_log2_ctb_size)) +
                                ps_sps->i2_pic_crop_top_offset * crop_unit_y;
                last_ctb_y = (last_row >> ps_sps->i1_log2_ctb_size) - 1;
                /* Since deblocking works with a shift of -4, -4 ,wait till next CTB row is processed */
                last_ctb_y++;
                /* In case of a  conformance window, an extra wait of one row might be needed */
                last_ctb_y++;
                last_ctb_y = MIN(last_ctb_y, (ps_sps->i2_pic_ht_in_ctb - 1));

                idx = (last_ctb_y * ps_sps->i2_pic_wd_in_ctb);

                /*Check if the row below is completely processed before proceeding with format conversion*/
                status = 1;
                for(ctb_in_row = 0; (WORD32)ctb_in_row < ps_sps->i2_pic_wd_in_ctb; ctb_in_row++)
                {
                    pu1_buf = (ps_codec->pu1_proc_map + idx + ctb_in_row);
                    status &= *pu1_buf;
                }

                if(status)
                {
                    break;
                }
                else
                {
                    ithread_yield();
                }
            }
        }


        if((IV_YUV_420SP_UV == ps_codec->e_chroma_fmt) || (IV_YUV_420SP_VU == ps_codec->e_chroma_fmt))
        {

            ps_codec->s_func_selector.ihevcd_fmt_conv_420sp_to_420sp_fptr(pu1_y_src, pu1_uv_src,
                                                                          pu1_y_dst_tmp, pu1_uv_dst_tmp,
                                                                          ps_codec->i4_disp_wd,
                                                                          num_rows,
                                                                          ps_codec->i4_strd,
                                                                          ps_codec->i4_strd,
                                                                          ps_codec->i4_disp_strd,
                                                                          ps_codec->i4_disp_strd);
        }
        else if(IV_YUV_420P == ps_codec->e_chroma_fmt)
        {

            if(0 == disable_luma_copy)
            {
                // copy luma
                WORD32 i;
                WORD32 num_cols = ps_codec->i4_disp_wd;

                for(i = 0; i < num_rows; i++)
                {
                    memcpy(pu1_y_dst_tmp, pu1_y_src, num_cols);
                    pu1_y_dst_tmp += ps_codec->i4_disp_strd;
                    pu1_y_src += ps_codec->i4_strd;
                }

                disable_luma_copy = 1;
            }

            ps_codec->s_func_selector.ihevcd_fmt_conv_420sp_to_420p_fptr(pu1_y_src, pu1_uv_src,
                                                                         pu1_y_dst_tmp, pu1_u_dst_tmp, pu1_v_dst_tmp,
                                                                         ps_codec->i4_disp_wd,
                                                                         num_rows,
                                                                         ps_codec->i4_strd,
                                                                         ps_codec->i4_strd,
                                                                         ps_codec->i4_disp_strd,
                                                                         (ps_codec->i4_disp_strd / 2),
                                                                         is_u_first,
                                                                         disable_luma_copy);

        }
        else if(IV_RGB_565 == ps_codec->e_chroma_fmt)
        {

            ps_codec->s_func_selector.ihevcd_fmt_conv_420sp_to_rgb565_fptr(pu1_y_src, pu1_uv_src,
                                                                           pu2_rgb_dst_tmp,
                                                                           ps_codec->i4_disp_wd,
                                                                           num_rows,
                                                                           ps_codec->i4_strd,
                                                                           ps_codec->i4_strd,
                                                                           ps_codec->i4_disp_strd,
                                                                           is_u_first);

        }
        else if(IV_RGBA_8888 == ps_codec->e_chroma_fmt)
        {
            ASSERT(is_u_first == 1);

            ps_codec->s_func_selector.ihevcd_fmt_conv_420sp_to_rgba8888_fptr(pu1_y_src,
                                                                             pu1_uv_src,
                                                                             pu4_rgb_dst_tmp,
                                                                             ps_codec->i4_disp_wd,
                                                                             num_rows,
                                                                             ps_codec->i4_strd,
                                                                             ps_codec->i4_strd,
                                                                             ps_codec->i4_disp_strd,
                                                                             is_u_first);

        }



    }
    return (ret);
}